

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_init_finish.c
# Opt level: O3

int dwarf_get_section_info_by_name
              (Dwarf_Debug dbg,char *section_name,Dwarf_Addr *section_addr,
              Dwarf_Unsigned *section_size,Dwarf_Error *error)

{
  int iVar1;
  
  iVar1 = dwarf_get_section_info_by_name_a
                    (dbg,section_name,section_addr,section_size,(Dwarf_Unsigned *)0x0,
                     (Dwarf_Unsigned *)0x0,error);
  return iVar1;
}

Assistant:

int
dwarf_get_section_info_by_name(Dwarf_Debug dbg,
    const char *section_name,
    Dwarf_Addr *section_addr,
    Dwarf_Unsigned *section_size,
    Dwarf_Error * error)
{
    return dwarf_get_section_info_by_name_a(dbg,
        section_name,
        section_addr,
        section_size,
        0,0,
        error);
}